

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O0

bool __thiscall DepsLog::Recompact(DepsLog *this,string *path,string *err)

{
  value_type pDVar1;
  Metrics *this_00;
  bool bVar2;
  int iVar3;
  Metric *pMVar4;
  char *pcVar5;
  reference ppNVar6;
  size_type sVar7;
  reference ppDVar8;
  reference ppNVar9;
  int *piVar10;
  char *__new;
  Metric *local_140;
  Deps *deps;
  iterator iStack_108;
  int old_id;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_100;
  iterator i;
  undefined1 local_f0 [8];
  DepsLog new_log;
  string temp_path;
  ScopedMetric metrics_h_scoped;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *err_local;
  string *path_local;
  DepsLog *this_local;
  
  local_28 = err;
  err_local = path;
  path_local = (string *)this;
  if ((Recompact(std::__cxx11::string_const&,std::__cxx11::string*)::metrics_h_metric == '\0') &&
     (iVar3 = __cxa_guard_acquire(&Recompact(std::__cxx11::string_const&,std::__cxx11::string*)::
                                   metrics_h_metric), this_00 = g_metrics, iVar3 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      local_140 = (Metric *)0x0;
      Recompact::metrics_h_metric = local_140;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,".ninja_deps recompact",&local_49);
      pMVar4 = Metrics::NewMetric(this_00,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
      Recompact::metrics_h_metric = pMVar4;
    }
    __cxa_guard_release(&Recompact(std::__cxx11::string_const&,std::__cxx11::string*)::
                         metrics_h_metric);
  }
  ScopedMetric::ScopedMetric
            ((ScopedMetric *)((long)&temp_path.field_2 + 8),Recompact::metrics_h_metric);
  Close(this);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &new_log.deps_.
                  super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,err_local,".recompact");
  pcVar5 = (char *)std::__cxx11::string::c_str();
  unlink(pcVar5);
  DepsLog((DepsLog *)local_f0);
  bVar2 = OpenForWrite((DepsLog *)local_f0,
                       (string *)
                       &new_log.deps_.
                        super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,local_28);
  if (bVar2) {
    local_100._M_current =
         (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(&this->nodes_);
    while( true ) {
      iStack_108 = std::vector<Node_*,_std::allocator<Node_*>_>::end(&this->nodes_);
      bVar2 = __gnu_cxx::operator!=(&local_100,&stack0xfffffffffffffef8);
      if (!bVar2) break;
      ppNVar6 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                ::operator*(&local_100);
      Node::set_id(*ppNVar6,-1);
      __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
      operator++(&local_100);
    }
    for (deps._4_4_ = 0;
        sVar7 = std::vector<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>::size(&this->deps_),
        deps._4_4_ < (int)sVar7; deps._4_4_ = deps._4_4_ + 1) {
      ppDVar8 = std::vector<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>::operator[]
                          (&this->deps_,(long)deps._4_4_);
      pDVar1 = *ppDVar8;
      if (pDVar1 != (value_type)0x0) {
        ppNVar9 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                            (&this->nodes_,(long)deps._4_4_);
        bVar2 = IsDepsEntryLiveFor(this,*ppNVar9);
        if (bVar2) {
          ppNVar9 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                              (&this->nodes_,(long)deps._4_4_);
          bVar2 = RecordDeps((DepsLog *)local_f0,*ppNVar9,pDVar1->mtime,pDVar1->node_count,
                             pDVar1->nodes);
          if (!bVar2) {
            Close((DepsLog *)local_f0);
            this_local._7_1_ = 0;
            goto LAB_001289d8;
          }
        }
      }
    }
    Close((DepsLog *)local_f0);
    std::vector<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>::swap
              (&this->deps_,
               (vector<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_> *)
               &new_log.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<Node_*,_std::allocator<Node_*>_>::swap
              (&this->nodes_,
               (vector<Node_*,_std::allocator<Node_*>_> *)((long)&new_log.file_path_.field_2 + 8));
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iVar3 = unlink(pcVar5);
    if (iVar3 < 0) {
      piVar10 = __errno_location();
      pcVar5 = strerror(*piVar10);
      std::__cxx11::string::operator=((string *)local_28,pcVar5);
      this_local._7_1_ = 0;
    }
    else {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      __new = (char *)std::__cxx11::string::c_str();
      iVar3 = rename(pcVar5,__new);
      if (iVar3 < 0) {
        piVar10 = __errno_location();
        pcVar5 = strerror(*piVar10);
        std::__cxx11::string::operator=((string *)local_28,pcVar5);
        this_local._7_1_ = 0;
      }
      else {
        this_local._7_1_ = 1;
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_001289d8:
  i._M_current._4_4_ = 1;
  ~DepsLog((DepsLog *)local_f0);
  std::__cxx11::string::~string
            ((string *)
             &new_log.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  ScopedMetric::~ScopedMetric((ScopedMetric *)((long)&temp_path.field_2 + 8));
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool DepsLog::Recompact(const string& path, string* err) {
  METRIC_RECORD(".ninja_deps recompact");

  Close();
  string temp_path = path + ".recompact";

  // OpenForWrite() opens for append.  Make sure it's not appending to a
  // left-over file from a previous recompaction attempt that crashed somehow.
  unlink(temp_path.c_str());

  DepsLog new_log;
  if (!new_log.OpenForWrite(temp_path, err))
    return false;

  // Clear all known ids so that new ones can be reassigned.  The new indices
  // will refer to the ordering in new_log, not in the current log.
  for (vector<Node*>::iterator i = nodes_.begin(); i != nodes_.end(); ++i)
    (*i)->set_id(-1);

  // Write out all deps again.
  for (int old_id = 0; old_id < (int)deps_.size(); ++old_id) {
    Deps* deps = deps_[old_id];
    if (!deps) continue;  // If nodes_[old_id] is a leaf, it has no deps.

    if (!IsDepsEntryLiveFor(nodes_[old_id]))
      continue;

    if (!new_log.RecordDeps(nodes_[old_id], deps->mtime,
                            deps->node_count, deps->nodes)) {
      new_log.Close();
      return false;
    }
  }

  new_log.Close();

  // All nodes now have ids that refer to new_log, so steal its data.
  deps_.swap(new_log.deps_);
  nodes_.swap(new_log.nodes_);

  if (unlink(path.c_str()) < 0) {
    *err = strerror(errno);
    return false;
  }

  if (rename(temp_path.c_str(), path.c_str()) < 0) {
    *err = strerror(errno);
    return false;
  }

  return true;
}